

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-fchmod.c
# Opt level: O1

int run_test_pipe_set_chmod(void)

{
  int iVar1;
  undefined8 uVar2;
  __dev_t *p_Var3;
  int64_t eval_b;
  int64_t eval_b_4;
  stat stat_buf;
  uv_pipe_t pipe_handle;
  __dev_t local_198;
  __dev_t local_190;
  stat64 local_188;
  undefined1 local_f8 [232];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,local_f8,0);
  local_188.st_dev = (__dev_t)iVar1;
  local_198 = 0;
  if (local_188.st_dev == 0) {
    iVar1 = uv_pipe_bind(local_f8,"/tmp/uv-test-sock");
    local_188.st_dev = (__dev_t)iVar1;
    local_198 = 0;
    if (local_188.st_dev != 0) goto LAB_001b36cf;
    iVar1 = uv_pipe_chmod(local_f8);
    if (iVar1 == -1) {
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_188.st_dev = 0;
      iVar1 = uv_loop_close(uVar2);
      local_198 = (__dev_t)iVar1;
      if (local_188.st_dev == local_198) {
        run_test_pipe_set_chmod_cold_24();
        return 7;
      }
      goto LAB_001b3747;
    }
    local_188.st_dev = (__dev_t)iVar1;
    local_198 = 0;
    if (local_188.st_dev != 0) goto LAB_001b36dc;
    memset(&local_188,0,0x90);
    iVar1 = stat64("/tmp/uv-test-sock",&local_188);
    local_198 = (__dev_t)iVar1;
    local_190 = 0;
    if (local_198 != 0) goto LAB_001b36e9;
    if ((local_188.st_mode >> 8 & 1) == 0) goto LAB_001b36f6;
    if ((local_188.st_mode & 0x20) == 0) goto LAB_001b36fb;
    if ((local_188.st_mode & 4) == 0) goto LAB_001b3700;
    iVar1 = uv_pipe_chmod(local_f8,2);
    local_198 = (__dev_t)iVar1;
    local_190 = 0;
    if (local_198 != 0) goto LAB_001b3705;
    stat64("/tmp/uv-test-sock",&local_188);
    if (-1 < (char)local_188.st_mode) goto LAB_001b3712;
    if ((local_188.st_mode & 0x10) == 0) goto LAB_001b3717;
    if ((local_188.st_mode & 2) == 0) goto LAB_001b371c;
    iVar1 = uv_pipe_chmod(local_f8,3);
    local_198 = (__dev_t)iVar1;
    local_190 = 0;
    if (local_198 != 0) goto LAB_001b3721;
    stat64("/tmp/uv-test-sock",&local_188);
    if ((local_188.st_mode >> 8 & 1) == 0) goto LAB_001b372e;
    if ((local_188.st_mode & 0x20) == 0) goto LAB_001b3733;
    if ((local_188.st_mode & 4) == 0) goto LAB_001b3738;
    if (-1 < (char)local_188.st_mode) goto LAB_001b373d;
    if ((local_188.st_mode & 0x10) == 0) goto LAB_001b3742;
    if ((local_188.st_mode & 2) == 0) goto LAB_001b3754;
    iVar1 = uv_pipe_chmod(0,3);
    local_198 = (__dev_t)iVar1;
    local_190 = 0xfffffffffffffff7;
    if (local_198 != 0xfffffffffffffff7) goto LAB_001b3759;
    iVar1 = uv_pipe_chmod(local_f8,data + 0x824ece);
    local_198 = (__dev_t)iVar1;
    local_190 = 0xffffffffffffffea;
    if (local_198 != 0xffffffffffffffea) goto LAB_001b3766;
    uv_close(local_f8,0);
    iVar1 = uv_pipe_chmod(local_f8,3);
    local_198 = (__dev_t)iVar1;
    local_190 = 0xfffffffffffffff7;
    if (local_198 == 0xfffffffffffffff7) {
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_198 = 0;
      iVar1 = uv_loop_close(uVar2);
      local_190 = (__dev_t)iVar1;
      if (local_198 == local_190) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b3780;
    }
  }
  else {
    run_test_pipe_set_chmod_cold_1();
LAB_001b36cf:
    run_test_pipe_set_chmod_cold_2();
LAB_001b36dc:
    run_test_pipe_set_chmod_cold_3();
LAB_001b36e9:
    run_test_pipe_set_chmod_cold_4();
LAB_001b36f6:
    run_test_pipe_set_chmod_cold_22();
LAB_001b36fb:
    run_test_pipe_set_chmod_cold_21();
LAB_001b3700:
    run_test_pipe_set_chmod_cold_20();
LAB_001b3705:
    run_test_pipe_set_chmod_cold_5();
LAB_001b3712:
    run_test_pipe_set_chmod_cold_19();
LAB_001b3717:
    run_test_pipe_set_chmod_cold_18();
LAB_001b371c:
    run_test_pipe_set_chmod_cold_17();
LAB_001b3721:
    run_test_pipe_set_chmod_cold_6();
LAB_001b372e:
    run_test_pipe_set_chmod_cold_16();
LAB_001b3733:
    run_test_pipe_set_chmod_cold_15();
LAB_001b3738:
    run_test_pipe_set_chmod_cold_14();
LAB_001b373d:
    run_test_pipe_set_chmod_cold_13();
LAB_001b3742:
    run_test_pipe_set_chmod_cold_12();
LAB_001b3747:
    run_test_pipe_set_chmod_cold_23();
LAB_001b3754:
    run_test_pipe_set_chmod_cold_11();
LAB_001b3759:
    run_test_pipe_set_chmod_cold_7();
LAB_001b3766:
    run_test_pipe_set_chmod_cold_8();
  }
  run_test_pipe_set_chmod_cold_9();
LAB_001b3780:
  p_Var3 = &local_198;
  run_test_pipe_set_chmod_cold_10();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(p_Var3,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_set_chmod) {
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;
  int r;
#ifndef _WIN32
  struct stat stat_buf;
#endif

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  /* No easy way to test if this works, we will only make sure that the call is
   * successful. */
  r = uv_pipe_chmod(&pipe_handle, UV_READABLE);
  if (r == UV_EPERM) {
    MAKE_VALGRIND_HAPPY(loop);
    RETURN_SKIP("Insufficient privileges to alter pipe fmode");
  }
  ASSERT_OK(r);
#ifndef _WIN32
  memset(&stat_buf, 0, sizeof(stat_buf));
  ASSERT_OK(stat(TEST_PIPENAME, &stat_buf));
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE);
  ASSERT_OK(r);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT_OK(r);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(NULL, UV_WRITABLE | UV_READABLE);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_pipe_chmod(&pipe_handle, 12345678);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&pipe_handle, NULL);
  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT_EQ(r, UV_EBADF);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}